

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  int *piVar1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  bool bVar6;
  uint uVar7;
  rc_size rVar8;
  row_iterator prVar9;
  bit_array *x_00;
  rc_data *__first;
  ulong uVar10;
  long lVar11;
  long lVar12;
  rc_data *__last;
  uint r_size;
  longdouble in_ST0;
  longdouble lVar13;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int selected;
  int local_b8;
  int local_b4;
  undefined1 local_b0 [20];
  longdouble local_9c;
  rc_size local_90;
  solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_88;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_80;
  undefined8 local_78;
  _Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_70;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_9c = obj_amp;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  lVar14 = in_ST4;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
  }
  else {
    local_88 = this + 0x10;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_80._M_head_impl = (col_value *)last._M_current;
    do {
      local_b8 = ((col_value *)first._M_current)->value;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_b0,(int)local_88);
      if (local_b0._8_8_ != local_b0._0_8_) {
        lVar12 = *(long *)(this + 0x50);
        prVar9 = (row_iterator)local_b0._8_8_;
        do {
          piVar1 = &prVar9->value;
          prVar9 = prVar9 + 1;
          lVar11 = (long)*piVar1 * 0x10;
          *(longdouble *)(lVar12 + lVar11) = *(longdouble *)(lVar12 + lVar11) * local_68;
        } while (prVar9 != (row_iterator)local_b0._0_8_);
      }
      rVar8 = solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_b0._8_8_,(row_iterator)local_b0._0_8_,x);
      __first = *(rc_data **)(this + 0x60);
      local_70.super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl
           = (_Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)
             (_Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>)first._M_current;
      if (rVar8.r_size != 0) {
        lVar12 = 0;
        lVar13 = in_ST0;
        lVar2 = in_ST1;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        in_ST4 = lVar14;
        do {
          in_ST3 = lVar5;
          in_ST2 = lVar4;
          in_ST1 = lVar3;
          in_ST0 = lVar2;
          x_00 = (bit_array *)(long)*(int *)((long)&__first->id + lVar12);
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x78),
                     (quadratic_cost_type<long_double> *)
                     (ulong)(uint)((row_iterator)(local_b0._8_8_ + x_00 * 8))->column,(int)x,x_00);
          __first = *(rc_data **)(this + 0x60);
          *(longdouble *)((long)&__first->value + lVar12) =
               *(longdouble *)((long)&__first->value + lVar12) + local_9c * lVar13;
          lVar12 = lVar12 + 0x20;
          lVar13 = in_ST0;
          lVar2 = in_ST1;
          lVar3 = in_ST2;
          lVar4 = in_ST3;
          lVar5 = in_ST4;
          lVar14 = in_ST4;
        } while (((ulong)rVar8 & 0xffffffff) << 5 != lVar12);
      }
      lVar12 = (long)rVar8.r_size;
      if (1 < lVar12) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        local_90 = rVar8;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar12,(int)LZCOUNT(lVar12) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar12);
        __last = __first + 1;
        lVar12 = lVar12 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar12 = lVar12 + -0x20;
        } while (lVar12 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        rVar8 = local_90;
      }
      piVar1 = (int *)(*(long *)(this + 0x68) + (long)local_b8 * 8);
      uVar7 = rVar8.c_size + *piVar1;
      r_size = rVar8.r_size;
      if ((int)r_size < (int)uVar7) {
        uVar7 = r_size;
      }
      local_b4 = uVar7 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_b8,piVar1);
      if (0 < (int)r_size) {
        uVar10 = (ulong)(r_size & 0x7fffffff);
        lVar12 = 0x14;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x60) + -0x14 + lVar12),
                     (int *)(*(long *)(this + 0x60) + lVar12));
          lVar12 = lVar12 + 0x20;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_b4);
      bVar6 = affect<baryonyx::itm::solver_equalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,x,(row_value *)local_b0._8_8_,local_b8,local_b4,r_size,local_48,
                         local_58);
      local_78._0_1_ = (byte)local_78 | bVar6;
      first._M_current =
           (pair<int,_int> *)
           ((long)local_70.super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                  _M_head_impl + 8);
    } while (first._M_current != (pair<int,_int> *)local_80._M_head_impl);
  }
  return (bool)((byte)local_78 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }